

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

LONGLONG quick_select_longlong(LONGLONG *arr,int n)

{
  long lVar1;
  LONGLONG LVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  LONGLONG t_1;
  int iVar11;
  uint uVar12;
  uint uVar13;
  LONGLONG t_3;
  LONGLONG t_2;
  
  uVar7 = n - 1;
  iVar6 = (n - ((int)uVar7 >> 0x1f)) + -1 >> 1;
  if (1 < n) {
    iVar8 = 0;
    do {
      uVar13 = iVar8 + 1;
      uVar10 = (ulong)uVar13;
      if (uVar7 == uVar13) {
        lVar1 = arr[iVar8];
        if (arr[(int)uVar7] < lVar1) {
          arr[iVar8] = arr[(int)uVar7];
          arr[(int)uVar7] = lVar1;
        }
        break;
      }
      iVar11 = (int)(iVar8 + uVar7) / 2;
      lVar1 = arr[iVar11];
      if (arr[(int)uVar7] < lVar1) {
        arr[iVar11] = arr[(int)uVar7];
        arr[(int)uVar7] = lVar1;
      }
      lVar1 = arr[iVar8];
      if (arr[(int)uVar7] < lVar1) {
        arr[iVar8] = arr[(int)uVar7];
        arr[(int)uVar7] = lVar1;
      }
      lVar1 = arr[iVar11];
      if (arr[iVar8] < lVar1) {
        arr[iVar11] = arr[iVar8];
        arr[iVar8] = lVar1;
      }
      LVar2 = arr[iVar11];
      arr[iVar11] = arr[(int)uVar13];
      arr[(int)uVar13] = LVar2;
      uVar13 = uVar7;
      while( true ) {
        lVar1 = arr[iVar8];
        uVar10 = (ulong)(int)uVar10;
        do {
          lVar3 = arr[uVar10 + 1];
          uVar10 = uVar10 + 1;
        } while (lVar3 < lVar1);
        lVar5 = (long)(int)uVar13 + 1;
        do {
          uVar12 = uVar13;
          lVar9 = lVar5;
          lVar4 = arr[lVar9 + -2];
          uVar13 = uVar12 - 1;
          lVar5 = lVar9 + -1;
        } while (lVar1 < lVar4);
        if (lVar9 + -1 <= (long)uVar10) break;
        arr[uVar10] = lVar4;
        arr[lVar9 + -2] = lVar3;
      }
      arr[iVar8] = lVar4;
      arr[lVar9 + -2] = lVar1;
      if ((int)uVar13 <= iVar6) {
        iVar8 = (int)uVar10;
      }
      if (iVar6 < (int)uVar12) {
        uVar7 = uVar12 - 2;
      }
    } while (iVar8 < (int)uVar7);
  }
  return arr[iVar6];
}

Assistant:

static LONGLONG quick_select_longlong(LONGLONG arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}